

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

optional<bool>
anon_unknown.dwarf_761729::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  StringEntry *pSVar6;
  StringEntry *pSVar7;
  pointer pcVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ushort uVar11;
  size_type sVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  bool bVar17;
  char *se_name [2];
  StringEntry *se [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  cmSystemToolsRPathInfo rp [2];
  cmELF elf;
  string local_50;
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar5 = 0xa0;
  paVar10 = &rp[0].Name.field_2;
  do {
    (((string *)(paVar10 + -1))->_M_dataplus)._M_p = (pointer)paVar10;
    *(size_type *)((long)paVar10 + -8) = 0;
    paVar10->_M_local_buf[0] = '\0';
    paVar10[1]._M_allocated_capacity = (size_type)(paVar10 + 2);
    *(undefined8 *)((long)paVar10 + 0x18) = 0;
    paVar10[2]._M_local_buf[0] = 0;
    paVar10 = paVar10 + 5;
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != 0);
  cmELF::cmELF(&elf,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid(&elf);
  if (!bVar2) {
    uVar16 = 0;
    bVar2 = true;
    uVar11 = 0;
    bVar17 = false;
    uVar4 = 0;
    goto LAB_00280760;
  }
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  se_name[0] = (char *)0x0;
  se_name[1] = (char *)0x0;
  pSVar6 = cmELF::GetRPath(&elf);
  if (pSVar6 != (StringEntry *)0x0) {
    se_name[0] = "RPATH";
    se[0] = pSVar6;
  }
  uVar4 = (uint)(pSVar6 != (StringEntry *)0x0);
  pSVar7 = cmELF::GetRunPath(&elf);
  if (pSVar7 == (StringEntry *)0x0) {
    if (pSVar6 != (StringEntry *)0x0) {
      iVar13 = 1;
      goto LAB_002805e8;
    }
    bVar2 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
            ::operator()(emptyCallback,emsg,&elf);
    uVar16 = (ushort)bVar2;
    bVar17 = false;
    bVar2 = true;
    uVar4 = 0;
  }
  else {
    uVar14 = (ulong)(uVar4 * 8);
    *(StringEntry **)((long)se + uVar14) = pSVar7;
    *(char **)((long)se_name + uVar14) = "RUNPATH";
    iVar13 = uVar4 + 1;
LAB_002805e8:
    bVar2 = true;
    uVar4 = 0;
    for (uVar14 = 0; bVar17 = (uint)(iVar13 << 3) == uVar14, !bVar17; uVar14 = uVar14 + 8) {
      if (uVar4 == 0) {
        __args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)se + uVar14);
        pcVar8 = __args_1[1]._M_dataplus._M_p;
LAB_0028063a:
        rp[(int)uVar4].Position = (unsigned_long)pcVar8;
        rp[(int)uVar4].Size = __args_1[1]._M_string_length;
        std::__cxx11::string::assign((char *)&rp[(int)uVar4].Name);
        outRPath.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        bVar3 = std::
                function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                ::operator()(adjustCallback,&outRPath,__args_1,*(char **)((long)se_name + uVar14),
                             emsg);
        if (bVar3) {
          bVar3 = true;
          if (outRPath.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            bVar2 = (bool)(bVar2 & outRPath.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload._M_value._M_string_length == 0);
            if (rp[(int)uVar4].Size <
                outRPath.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length + 1) {
              if (emsg != (string *)0x0) {
                cmStrCat<char_const(&)[42],char_const*&,char_const(&)[8]>
                          (&local_50,(char (*) [42])"The replacement path is too long for the ",
                           (char **)((long)se_name + uVar14),(char (*) [8])0x6d7974);
                std::__cxx11::string::operator=((string *)emsg,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
              }
              bVar3 = false;
            }
            else {
              std::__cxx11::string::operator=((string *)&rp[(int)uVar4].Value,(string *)&outRPath);
              uVar4 = uVar4 + 1;
            }
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar3 = false;
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&outRPath);
        if (!bVar3) break;
      }
      else {
        __args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)se + uVar14);
        pcVar8 = __args_1[1]._M_dataplus._M_p;
        if ((pointer)rp[0].Position != pcVar8) goto LAB_0028063a;
      }
    }
    uVar16 = 0;
  }
  uVar11 = 0x100;
LAB_00280760:
  cmELF::~cmELF(&elf);
  if (bVar17) {
    uVar11 = 0x100;
    uVar16 = 1;
    if (uVar4 != 0) {
      if (bVar2) {
        bVar2 = cmSystemTools::RemoveRPath(file,emsg,changed);
        uVar16 = (ushort)bVar2;
      }
      else {
        std::ofstream::ofstream(&elf,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
        if ((elf.ErrorMessage.field_2._M_local_buf
             [*(long *)((long)elf.Internal._M_t.
                              super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>
                              .super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl + -0x18) +
              8] & 5U) == 0) {
          uVar14 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar14 = 0;
          }
          uVar1 = 0;
          do {
            uVar15 = uVar1;
            if (uVar15 == uVar14) {
              std::ofstream::~ofstream(&elf);
              if (changed != (bool *)0x0) {
                *changed = true;
              }
              uVar11 = 0x100;
              goto LAB_00280960;
            }
            plVar9 = (long *)std::ostream::seekp(&elf,rp[uVar15].Position,0);
            if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
              if (emsg == (string *)0x0) goto LAB_00280950;
              cmStrCat<char_const(&)[18],std::__cxx11::string&,char_const(&)[11]>
                        ((string *)&outRPath,(char (*) [18])"Error seeking to ",&rp[uVar15].Name,
                         (char (*) [11])0x6d3022);
              goto LAB_00280936;
            }
            std::operator<<((ostream *)&elf,(string *)&rp[uVar15].Value);
            for (sVar12 = rp[uVar15].Value._M_string_length; sVar12 < rp[uVar15].Size;
                sVar12 = sVar12 + 1) {
              std::operator<<((ostream *)&elf,'\0');
            }
            uVar1 = uVar15 + 1;
          } while ((elf.ErrorMessage.field_2._M_local_buf
                    [*(long *)((long)elf.Internal._M_t.
                                     super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>
                                     .super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl +
                              -0x18) + 8] & 5U) == 0);
          if (emsg != (string *)0x0) {
            cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[21]>
                      ((string *)&outRPath,(char (*) [23])"Error writing the new ",&rp[uVar15].Name,
                       (char (*) [21])0x6d304a);
LAB_00280936:
            std::__cxx11::string::operator=((string *)emsg,(string *)&outRPath);
            std::__cxx11::string::~string((string *)&outRPath);
          }
        }
        else if (emsg != (string *)0x0) {
          std::__cxx11::string::assign((char *)emsg);
        }
LAB_00280950:
        uVar11 = 0x100;
        std::ofstream::~ofstream(&elf);
        uVar16 = 0;
      }
    }
  }
LAB_00280960:
  lVar5 = 0x50;
  do {
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
              ((cmSystemToolsRPathInfo *)((long)&rp[0].Position + lVar5));
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != -0x50);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar16 | uVar11);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}